

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O3

void __thiscall
cmCTestSubmitHandler::ParseResponse
          (cmCTestSubmitHandler *this,cmCTestSubmitHandlerVectorOfChar *chunk)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCTest *pcVar2;
  pointer pcVar3;
  long lVar4;
  ostream *poVar5;
  string output;
  ResponseParser parser;
  ostringstream cmCTestLog_msg;
  string local_2a0;
  long *local_280;
  long local_270 [2];
  ResponseParser local_260;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [6];
  ios_base local_128 [264];
  
  paVar1 = &local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  local_2a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::
  _M_replace_dispatch<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)&local_2a0,paVar1,paVar1,
             (chunk->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (chunk->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  lVar4 = std::__cxx11::string::find((char *)&local_2a0,0x595b31,0);
  if (lVar4 != -1) {
    cmXMLParser::cmXMLParser(&local_260.super_cmXMLParser);
    local_260.Filename._M_dataplus._M_p = (pointer)&local_260.Filename.field_2;
    local_260.super_cmXMLParser._vptr_cmXMLParser = (_func_int **)&PTR__ResponseParser_0070d328;
    local_260.Status = STATUS_OK;
    local_260.Filename._M_string_length = 0;
    local_260.Filename.field_2._M_local_buf[0] = '\0';
    local_260.MD5._M_dataplus._M_p = (pointer)&local_260.MD5.field_2;
    local_260.MD5._M_string_length = 0;
    local_260.MD5.field_2._M_local_buf[0] = '\0';
    local_260.Message._M_dataplus._M_p = (pointer)&local_260.Message.field_2;
    local_260.Message._M_string_length = 0;
    local_260.Message.field_2._M_local_buf[0] = '\0';
    local_260.BuildID._M_dataplus._M_p = (pointer)&local_260.BuildID.field_2;
    local_260.BuildID._M_string_length = 0;
    local_260.BuildID.field_2._M_local_buf[0] = '\0';
    local_260.CurrentValue.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_260.CurrentValue.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_260.CurrentValue.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmXMLParser::Parse(&local_260.super_cmXMLParser,local_2a0._M_dataplus._M_p);
    if (local_260.Status != STATUS_OK) {
      this->HasErrors = true;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"   Submission failed: ",0x16);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,local_260.Message._M_dataplus._M_p,
                          local_260.Message._M_string_length);
      std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x1d2,(char *)local_280,false);
      if (local_280 != local_270) {
        operator_delete(local_280,local_270[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base(local_128);
      ResponseParser::~ResponseParser(&local_260);
      goto LAB_001a260a;
    }
    cmCTest::SetBuildID((this->super_cmCTestGenericHandler).CTest,&local_260.BuildID);
    ResponseParser::~ResponseParser(&local_260);
  }
  cmsys::SystemTools::UpperCase((string *)local_198,&local_2a0);
  std::__cxx11::string::operator=((string *)&local_2a0,(string *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_188[0]._M_allocated_capacity + 1);
  }
  lVar4 = std::__cxx11::string::find((char *)&local_2a0,0x59101f,0);
  if (lVar4 != -1) {
    this->HasWarnings = true;
  }
  lVar4 = std::__cxx11::string::find((char *)&local_2a0,0x5f2062,0);
  if (lVar4 != -1) {
    this->HasErrors = true;
  }
  if ((this->HasWarnings != false) || (this->HasErrors == true)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"   Server Response:\n",0x14);
    pcVar3 = (chunk->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((chunk->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish != pcVar3) {
      std::ostream::write(local_198,(long)pcVar3);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x1e2,(char *)local_260.super_cmXMLParser._vptr_cmXMLParser,false);
    if ((ReportFunction *)local_260.super_cmXMLParser._vptr_cmXMLParser !=
        &local_260.super_cmXMLParser.ReportCallback) {
      operator_delete(local_260.super_cmXMLParser._vptr_cmXMLParser,
                      (ulong)(local_260.super_cmXMLParser.ReportCallback + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base(local_128);
  }
LAB_001a260a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a0._M_dataplus._M_p,
                    CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                             local_2a0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmCTestSubmitHandler::ParseResponse(
  cmCTestSubmitHandlerVectorOfChar chunk)
{
  std::string output;
  output.append(chunk.begin(), chunk.end());

  if (output.find("<cdash") != std::string::npos) {
    ResponseParser parser;
    parser.Parse(output.c_str());

    if (parser.Status != ResponseParser::STATUS_OK) {
      this->HasErrors = true;
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "   Submission failed: " << parser.Message << std::endl);
      return;
    }
    this->CTest->SetBuildID(parser.BuildID);
  }
  output = cmSystemTools::UpperCase(output);
  if (output.find("WARNING") != std::string::npos) {
    this->HasWarnings = true;
  }
  if (output.find("ERROR") != std::string::npos) {
    this->HasErrors = true;
  }

  if (this->HasWarnings || this->HasErrors) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   Server Response:\n"
                 << cmCTestLogWrite(chunk.data(), chunk.size()) << "\n");
  }
}